

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap.cpp
# Opt level: O1

void __thiscall QPixmap::detach(QPixmap *this)

{
  int *piVar1;
  QPlatformPixmap *pQVar2;
  QExplicitlySharedDataPointer<QPlatformPixmap> QVar3;
  long in_FS_OFFSET;
  undefined8 local_68;
  undefined8 uStack_60;
  QPixmap local_50;
  undefined1 local_38 [16];
  QExplicitlySharedDataPointer<QPlatformPixmap> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->data).d.ptr;
  if (pQVar2 != (QPlatformPixmap *)0x0) {
    if (pQVar2->id == 0) {
      QImage::detach((QImage *)(pQVar2 + 1));
    }
    pQVar2 = (this->data).d.ptr;
    if ((pQVar2->is_cached != 0) &&
       ((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 1)) {
      QImagePixmapCleanupHooks::executePlatformPixmapModificationHooks(pQVar2);
    }
    if ((((this->data).d.ptr)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i != 1) {
      local_68 = 0;
      uStack_60 = 0xffffffffffffffff;
      copy(&local_50,(EVP_PKEY_CTX *)this,(EVP_PKEY_CTX *)&local_68);
      local_28.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)&DAT_aaaaaaaaaaaaaaaa;
      local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QPaintDevice::QPaintDevice((QPaintDevice *)local_38);
      QVar3.d.ptr = local_50.data.d.ptr;
      local_38._0_8_ = &PTR__QPixmap_007e3618;
      local_50.data.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)(QPlatformPixmap *)0x0;
      local_28.d.ptr = (totally_ordered_wrapper<QPlatformPixmap_*>)(this->data).d.ptr;
      (this->data).d.ptr = (QPlatformPixmap *)QVar3.d.ptr;
      ~QPixmap((QPixmap *)local_38);
      ~QPixmap(&local_50);
    }
    piVar1 = &((this->data).d.ptr)->detach_no;
    *piVar1 = *piVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPixmap::detach()
{
    if (!data)
        return;

    // QPixmap.data member may be QRuntimePlatformPixmap so use handle() function to get
    // the actual underlying runtime pixmap data.
    QPlatformPixmap *pd = handle();
    QPlatformPixmap::ClassId id = pd->classId();
    if (id == QPlatformPixmap::RasterClass) {
        QRasterPlatformPixmap *rasterData = static_cast<QRasterPlatformPixmap*>(pd);
        rasterData->image.detach();
    }

    if (data->is_cached && data->ref.loadRelaxed() == 1)
        QImagePixmapCleanupHooks::executePlatformPixmapModificationHooks(data.data());

    if (data->ref.loadRelaxed() != 1) {
        *this = copy();
    }
    ++data->detach_no;
}